

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LA32WaveGenerator.cpp
# Opt level: O0

void __thiscall
MT32Emu::LA32WaveGenerator::generateNextSawtoothCosineLogSample
          (LA32WaveGenerator *this,LogSample *logSample)

{
  uint uVar1;
  Tables *pTVar2;
  Bit32u sawtoothCosinePosition;
  LogSample *logSample_local;
  LA32WaveGenerator *this_local;
  
  uVar1 = this->wavePosition + 0x40000;
  if ((uVar1 & 0x40000) == 0) {
    pTVar2 = Tables::getInstance();
    logSample->logValue = pTVar2->logsin9[uVar1 >> 9 & 0x1ff];
  }
  else {
    pTVar2 = Tables::getInstance();
    logSample->logValue = pTVar2->logsin9[(uVar1 >> 9 ^ 0xffffffff) & 0x1ff];
  }
  logSample->logValue = logSample->logValue << 2;
  logSample->sign = (uint)((uVar1 & 0x80000) != 0);
  return;
}

Assistant:

void LA32WaveGenerator::generateNextSawtoothCosineLogSample(LogSample &logSample) const {
	Bit32u sawtoothCosinePosition = wavePosition + (1 << 18);
	if ((sawtoothCosinePosition & (1 << 18)) > 0) {
		logSample.logValue = Tables::getInstance().logsin9[~(sawtoothCosinePosition >> 9) & 511];
	} else {
		logSample.logValue = Tables::getInstance().logsin9[(sawtoothCosinePosition >> 9) & 511];
	}
	logSample.logValue <<= 2;
	logSample.sign = ((sawtoothCosinePosition & (1 << 19)) == 0) ? LogSample::POSITIVE : LogSample::NEGATIVE;
}